

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineRobustnessCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineRobustnessCreateInfo>
          (Impl *this,VkPipelineRobustnessCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkPipelineRobustnessCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineRobustnessCreateInfo>(alloc,count);
    if (pVVar1 != (VkPipelineRobustnessCreateInfo *)0x0) {
      pVVar1 = (VkPipelineRobustnessCreateInfo *)memmove(pVVar1,src,count << 5);
      return pVVar1;
    }
  }
  return (VkPipelineRobustnessCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}